

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index_buffered_region.cc
# Opt level: O1

S2LatLngRect * __thiscall
S2ShapeIndexBufferedRegion::GetRectBound
          (S2LatLngRect *__return_storage_ptr__,S2ShapeIndexBufferedRegion *this)

{
  Iterator *pIVar1;
  S1Angle distance;
  S2LatLngRect orig_rect;
  S2ShapeIndexRegion<S2ShapeIndex> local_68;
  S2LatLngRect local_40;
  
  local_68.contains_query_.index_ = (this->query_).base_.index_;
  pIVar1 = &local_68.contains_query_.it_;
  local_68.super_S2Region._vptr_S2Region = (_func_int **)&PTR__S2ShapeIndexRegion_002c2828;
  local_68.contains_query_.options_.vertex_model_ = SEMI_OPEN;
  (*(local_68.contains_query_.index_)->_vptr_S2ShapeIndex[6])
            (pIVar1,local_68.contains_query_.index_,2);
  local_68.iter_ = pIVar1;
  S2ShapeIndexRegion<S2ShapeIndex>::GetRectBound(&local_40,&local_68);
  if (local_68.contains_query_.it_.iter_._M_t.
      super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
      ._M_t.
      super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
      .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl !=
      (__uniq_ptr_data<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_68.contains_query_.it_.iter_._M_t.
                          super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                          .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl +
                8))();
  }
  distance = S1ChordAngle::ToAngle(&this->radius_);
  S2LatLngRect::ExpandedByDistance(__return_storage_ptr__,&local_40,distance);
  return __return_storage_ptr__;
}

Assistant:

S2LatLngRect S2ShapeIndexBufferedRegion::GetRectBound() const {
  S2LatLngRect orig_rect = MakeS2ShapeIndexRegion(&index()).GetRectBound();
  return orig_rect.ExpandedByDistance(radius_.ToAngle());
}